

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transform.cpp
# Opt level: O2

void parallel_transform<std::vector<int,std::allocator<int>>,tf::GuidedPartitioner<tf::DefaultClosureWrapper>>
               (size_t W)

{
  int iVar1;
  _List_node_base *p_Var2;
  code *pcVar3;
  double dVar4;
  char extraout_AL;
  _Self __tmp;
  time_t tVar5;
  _List_node_base *p_Var6;
  long lVar7;
  Executor *this;
  pointer piVar8;
  iterator tgt_beg;
  const_iterator src_end;
  ulong local_368;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tgt;
  vector<int,_std::allocator<int>_> src;
  Task to;
  Task from;
  const_iterator src_beg;
  shared_ptr<tf::WorkerInterface> local_308;
  _List_node_base *local_2f8;
  undefined4 local_2f0;
  ResultBuilder DOCTEST_RB;
  Result local_270;
  Taskflow taskflow;
  string local_188;
  Executor executor;
  
  tVar5 = time((time_t *)0x0);
  srand((uint)tVar5);
  tf::Taskflow::Taskflow(&taskflow);
  local_308.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_308.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&executor,W,&local_308);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_308.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  local_368 = 0;
  do {
    if (999 < local_368) {
      tf::Executor::~Executor(&executor);
      tf::Taskflow::~Taskflow(&taskflow);
      return;
    }
    for (lVar7 = 0; lVar7 != 0x14; lVar7 = lVar7 + 4) {
      iVar1 = *(int *)((long)&DAT_0013a118 + lVar7);
      std::
      vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      ::clear(&taskflow._graph.
               super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             );
      src_beg._M_current = (int *)0x0;
      src_end._M_current = (int *)0x0;
      tgt_beg._M_node = (_List_node_base *)0x0;
      src.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)0x0;
      src.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
           (pointer)0x0;
      src.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      tgt.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&tgt;
      tgt.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node._M_size = 0;
      tgt.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_prev =
           tgt.
           super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
      std::
      vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      ::clear(&taskflow._graph.
               super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             );
      DOCTEST_RB.super_AssertData.m_test_case = (TestCaseData *)&src;
      DOCTEST_RB.super_AssertData._8_8_ = &local_368;
      DOCTEST_RB.super_AssertData.m_file = (char *)&tgt;
      DOCTEST_RB.super_AssertData._40_8_ = &tgt_beg;
      DOCTEST_RB.super_AssertData._24_8_ = &src_beg;
      DOCTEST_RB.super_AssertData.m_expr = (char *)&src_end;
      tf::FlowBuilder::
      emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_transform_cpp:33:36),_nullptr>
                ((FlowBuilder *)&from,(anon_class_48_6_c0e1b691 *)&taskflow);
      tf::FlowBuilder::
      transform<std::reference_wrapper<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>,_std::reference_wrapper<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>,_std::reference_wrapper<std::_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_transform_cpp:46:9),_tf::GuidedPartitioner<tf::DefaultClosureWrapper>,_nullptr>
                ((FlowBuilder *)&to,&taskflow,&src_beg,&src_end,&tgt_beg,(long)iVar1);
      tf::Node::_precede(from._node,to._node);
      this = &executor;
      tf::Executor::run((Future<void> *)&DOCTEST_RB.super_AssertData,this,&taskflow);
      std::__basic_future<void>::wait((__basic_future<void> *)&DOCTEST_RB.super_AssertData,this);
      tf::Future<void>::~Future((Future<void> *)&DOCTEST_RB.super_AssertData);
      p_Var6 = tgt.
               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl._M_node.super__List_node_base._M_next;
      for (piVar8 = src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          piVar8 != src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish; piVar8 = piVar8 + 1) {
        DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
        DOCTEST_RB.super_AssertData._71_2_ = 0x17;
        DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
        DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
        local_2f0 = 0xc;
        DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
        DOCTEST_RB.super_AssertData.m_file =
             "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_transform.cpp"
        ;
        DOCTEST_RB.super_AssertData.m_line = 0x3b;
        DOCTEST_RB.super_AssertData.m_expr = "*d_itr++ == std::to_string(*s_itr++ + 10)";
        DOCTEST_RB.super_AssertData.m_failed = true;
        DOCTEST_RB.super_AssertData.m_threw = false;
        DOCTEST_RB.super_AssertData.m_threw_as = false;
        DOCTEST_RB.super_AssertData.m_exception_type = "";
        DOCTEST_RB.super_AssertData.m_exception_string = "";
        p_Var2 = p_Var6->_M_next;
        local_2f8 = p_Var6 + 1;
        std::__cxx11::to_string(&local_188,*piVar8 + 10);
        doctest::detail::Expression_lhs<std::__cxx11::string_const&>::operator==
                  (&local_270,(Expression_lhs<std::__cxx11::string_const&> *)&local_2f8,&local_188);
        doctest::detail::ResultBuilder::setResult
                  ((ResultBuilder *)&DOCTEST_RB.super_AssertData,&local_270);
        doctest::String::~String(&local_270.m_decomp);
        dVar4 = (double)std::__cxx11::string::~string((string *)&local_188);
        dVar4 = doctest::detail::ResultBuilder::log
                          ((ResultBuilder *)&DOCTEST_RB.super_AssertData,dVar4);
        if (extraout_AL != '\0') {
          pcVar3 = (code *)swi(3);
          (*pcVar3)(SUB84(dVar4,0));
          return;
        }
        doctest::detail::ResultBuilder::react((ResultBuilder *)&DOCTEST_RB.super_AssertData);
        doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
        p_Var6 = p_Var2;
      }
      std::__cxx11::
      _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_clear(&tgt.
                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                );
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&src.super__Vector_base<int,_std::allocator<int>_>);
    }
    local_368 = local_368 * 2 + 2;
  } while( true );
}

Assistant:

void parallel_transform(size_t W) {

  std::srand(static_cast<unsigned int>(time(NULL)));

  tf::Taskflow taskflow;
  tf::Executor executor(W);

  for(size_t N=0; N<1000; N=(N+1)*2) {
    for(size_t c : {0, 1, 3, 7, 99}) {

      taskflow.clear();

      typename T::const_iterator src_beg;
      typename T::const_iterator src_end;
      std::list<std::string>::iterator tgt_beg;

      T src;
      std::list<std::string> tgt;

      taskflow.clear();

      auto from = taskflow.emplace([&](){
        src.resize(N);
        for(auto& d : src) {
          d = ::rand() % 10;
          tgt.emplace_back("hi");
        }
        src_beg = src.begin();
        src_end = src.end();
        tgt_beg = tgt.begin();
      });

      auto to = taskflow.transform(
        std::ref(src_beg), std::ref(src_end), std::ref(tgt_beg),
        [] (const auto& in) {
          return std::to_string(in+10);
        },
        P(c)
      );

      from.precede(to);

      executor.run(taskflow).wait();

      auto s_itr = src.begin();
      auto d_itr = tgt.begin();
      while(s_itr != src.end()) {
        REQUIRE(*d_itr++ == std::to_string(*s_itr++ + 10));
      }
    }
  }
}